

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::ConfigureFinalPass(cmMakefile *this)

{
  bool bVar1;
  char *lhss;
  __node_base *p_Var2;
  allocator local_31;
  string local_30;
  
  FinalPass(this);
  std::__cxx11::string::string((string *)&local_30,"CMAKE_BACKWARDS_COMPATIBILITY",&local_31);
  lhss = GetDefinition(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  if (lhss != (char *)0x0) {
    bVar1 = cmSystemTools::VersionCompare(OP_LESS,lhss,"2.4");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)&local_30,
                 "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less than 2.4. This version of CMake only supports backwards compatibility with CMake 2.4 or later. For compatibility with older versions please use any CMake 2.8.x release or lower."
                 ,&local_31);
      IssueMessage(this,FATAL_ERROR,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  p_Var2 = &(this->Targets)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    if (*(int *)&p_Var2[0x61]._M_nxt != 7) {
      cmTarget::FinishConfigure((cmTarget *)(p_Var2 + 5));
    }
  }
  return;
}

Assistant:

void cmMakefile::ConfigureFinalPass()
{
  this->FinalPass();
  const char* oldValue
    = this->GetDefinition("CMAKE_BACKWARDS_COMPATIBILITY");
  if (oldValue && cmSystemTools::VersionCompare(
        cmSystemTools::OP_LESS, oldValue, "2.4"))
    {
    this->IssueMessage(
      cmake::FATAL_ERROR,
      "You have set CMAKE_BACKWARDS_COMPATIBILITY to a CMake version less "
      "than 2.4. This version of CMake only supports backwards compatibility "
      "with CMake 2.4 or later. For compatibility with older versions please "
      "use any CMake 2.8.x release or lower.");
    }
  for (cmTargets::iterator l = this->Targets.begin();
       l != this->Targets.end(); l++)
    {
    if (l->second.GetType() == cmTarget::INTERFACE_LIBRARY)
      {
      continue;
      }
    l->second.FinishConfigure();
    }
}